

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

Vec3 __thiscall rr::advblend::setLum(advblend *this,Vec3 *cbase,Vec3 *clum)

{
  uint uVar1;
  float fVar2;
  float s;
  undefined8 extraout_XMM0_Qa;
  uint uVar3;
  Vector<float,_3> VVar4;
  Vec3 VVar5;
  Vec3 color;
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  tcu local_38 [12];
  Vector<float,_3> local_2c;
  Vec3 VVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  
  fVar2 = luminosity(cbase);
  s = luminosity(clum);
  tcu::Vector<float,_3>::Vector(&local_44,s - fVar2);
  tcu::operator+((tcu *)&local_50,cbase,&local_44);
  fVar2 = (float)(~-(uint)(local_50.m_data[0] <= local_50.m_data[1]) & (uint)local_50.m_data[1] |
                 -(uint)(local_50.m_data[0] <= local_50.m_data[1]) & (uint)local_50.m_data[0]);
  uVar1 = -(uint)(fVar2 <= local_50.m_data[2]);
  fVar2 = (float)(~uVar1 & (uint)local_50.m_data[2] | uVar1 & (uint)fVar2);
  if (0.0 <= fVar2) {
    fVar2 = (float)(~-(uint)(local_50.m_data[1] <= local_50.m_data[0]) & (uint)local_50.m_data[1] |
                   (uint)local_50.m_data[0] & -(uint)(local_50.m_data[1] <= local_50.m_data[0]));
    uVar1 = -(uint)(local_50.m_data[2] <= fVar2);
    fVar2 = (float)(~uVar1 & (uint)local_50.m_data[2] | uVar1 & (uint)fVar2);
    if (fVar2 <= 1.0) {
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)this,&local_50);
      VVar6.m_data[0] = (float)(int)extraout_XMM0_Qa;
      uVar8._4_4_ = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      register0x00001240 = fVar2;
      return (Vec3)VVar6.m_data;
    }
    tcu::operator-(local_38,&local_50,s);
    tcu::operator*((tcu *)&local_2c,1.0 - s,(Vector<float,_3> *)local_38);
    uVar1 = -(uint)(s != fVar2);
    uVar3 = (uint)(fVar2 - s) & uVar1;
  }
  else {
    tcu::operator-(local_38,&local_50,s);
    tcu::operator*((tcu *)&local_2c,s,(Vector<float,_3> *)local_38);
    uVar1 = -(uint)(s != fVar2);
    uVar3 = (uint)(s - fVar2) & uVar1;
  }
  tcu::operator/((tcu *)&local_44,&local_2c,(float)(~uVar1 & 0x3f800000 | uVar3));
  VVar4 = tcu::operator+((tcu *)this,s,&local_44);
  VVar5.m_data[0] = VVar4.m_data[0];
  uVar7._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  return (Vec3)VVar5.m_data;
}

Assistant:

Vec3 setLum (const Vec3& cbase, const Vec3& clum)
{
	const float		lbase	= luminosity(cbase);
	const float		llum	= luminosity(clum);
	const float		ldiff	= llum - lbase;
	const Vec3		color	= cbase + Vec3(ldiff);
	const float		minC	= minComp(color);
	const float		maxC	= maxComp(color);

	if (minC < 0.0f)
		return llum + ((color-llum)*llum / (llum != minC ? (llum-minC) : 1.0f));
	else if (maxC > 1.0f)
		return llum + ((color-llum)*(1.0f-llum) / (llum != maxC ? (maxC-llum) : 1.0f));
	else
		return color;
}